

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void EMIT_OP_REG_NUM(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1,uint num)

{
  x86Instruction *pxVar1;
  ulong uVar2;
  x86Command xVar3;
  undefined4 uStack_3c;
  undefined4 uStack_34;
  
  xVar3 = o_mov;
  if (op != o_movsx) {
    xVar3 = op;
  }
  uVar2 = (ulong)(xVar3 - o_add);
  if (xVar3 - o_add < 0x3d) {
    if ((0xed0000000001ddaU >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0xc000000000005U >> (uVar2 & 0x3f) & 1) == 0) {
        if ((0x1000000000002000U >> (uVar2 & 0x3f) & 1) != 0) {
          ctx->genRegRead[reg1] = true;
          goto LAB_0027b8ee;
        }
        goto LAB_0027b94e;
      }
      if (reg1 == rESP) goto LAB_0027b8ee;
    }
    CodeGenGenericContext::ReadAndModifyRegister(ctx,reg1);
  }
  else {
LAB_0027b94e:
    if (xVar3 != o_mov) {
      __assert_fail("!\"unknown instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                    ,0x484,
                    "void EMIT_OP_REG_NUM(CodeGenGenericContext &, x86Command, x86Reg, unsigned int)"
                   );
    }
    if ((ctx->genReg[reg1].type == argNumber) && (ctx->genReg[reg1].field_1.reg == num)) {
      ctx->optimizationCount = ctx->optimizationCount + 1;
      return;
    }
    CodeGenGenericContext::OverwriteRegisterWithValue
              (ctx,reg1,(x86Argument)
                        ZEXT1632(CONCAT88(CONCAT44(uStack_34,num),CONCAT44(uStack_3c,1))));
  }
LAB_0027b8ee:
  pxVar1 = ctx->x86Op;
  pxVar1->name = xVar3;
  (pxVar1->argA).type = argReg;
  (pxVar1->argA).field_1.reg = reg1;
  pxVar1 = ctx->x86Op;
  (pxVar1->argB).type = argNumber;
  (pxVar1->argB).field_1.labelID = num;
  ctx->x86Op = ctx->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_REG_NUM(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1, unsigned num)
{
	if(op == o_movsx)
		op = o_mov;

#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_mov:
		// Skip move if the target already contains the same number
		if(ctx.genReg[reg1].type == x86Argument::argNumber && ctx.genReg[reg1].num == int(num))
		{
			ctx.optimizationCount++;
			return;
		}

		ctx.OverwriteRegisterWithValue(reg1, x86Argument(num));
		break;
	case o_add:
	case o_sub:
	case o_add64:
	case o_sub64:
		// Stack frame setup
		if(reg1 == rESP)
			break;

		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_adc:
	case o_sbb:
	case o_imul:
	case o_and:
	case o_or:
	case o_xor:
	case o_shl:
	case o_sal:
	case o_sar:
	case o_imul64:
	case o_and64:
	case o_or64:
	case o_xor64:
	case o_sal64:
	case o_sar64:
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_cmp:
	case o_cmp64:
		ctx.ReadRegister(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argNumber;
	ctx.x86Op->argB.num = num;
	ctx.x86Op++;
}